

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UnicodeString::lastIndexOf
          (UnicodeString *this,UChar *srcChars,int32_t srcStart,int32_t srcLength,int32_t start,
          int32_t length)

{
  UBool UVar1;
  char16_t *pcVar2;
  UChar *pUVar3;
  UChar *match;
  UChar *array;
  int32_t length_local;
  int32_t start_local;
  int32_t srcLength_local;
  int32_t srcStart_local;
  UChar *srcChars_local;
  UnicodeString *this_local;
  
  array._0_4_ = length;
  array._4_4_ = start;
  length_local = srcLength;
  start_local = srcStart;
  _srcLength_local = srcChars;
  srcChars_local = (UChar *)this;
  UVar1 = isBogus(this);
  if ((((UVar1 == '\0') && (_srcLength_local != (UChar *)0x0)) && (-1 < start_local)) &&
     (length_local != 0)) {
    if ((length_local < 0) && (_srcLength_local[start_local] == L'\0')) {
      this_local._4_4_ = -1;
    }
    else {
      pinIndices(this,(int32_t *)((long)&array + 4),(int32_t *)&array);
      pcVar2 = getArrayStart(this);
      pUVar3 = u_strFindLast_63(pcVar2 + array._4_4_,(int32_t)array,_srcLength_local + start_local,
                                length_local);
      if (pUVar3 == (UChar *)0x0) {
        this_local._4_4_ = -1;
      }
      else {
        this_local._4_4_ = (int32_t)((long)pUVar3 - (long)pcVar2 >> 1);
      }
    }
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int32_t 
UnicodeString::lastIndexOf(const UChar *srcChars,
               int32_t srcStart,
               int32_t srcLength,
               int32_t start,
               int32_t length) const
{
  if(isBogus() || srcChars == 0 || srcStart < 0 || srcLength == 0) {
    return -1;
  }

  // UnicodeString does not find empty substrings
  if(srcLength < 0 && srcChars[srcStart] == 0) {
    return -1;
  }

  // get the indices within bounds
  pinIndices(start, length);

  // find the last occurrence of the substring
  const UChar *array = getArrayStart();
  const UChar *match = u_strFindLast(array + start, length, srcChars + srcStart, srcLength);
  if(match == NULL) {
    return -1;
  } else {
    return (int32_t)(match - array);
  }
}